

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1WarpFilterTest_CheckOutput_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1WarpFilterTest_CheckOutput_Test> *this
          )

{
  Test *this_00;
  
  WithParamInterface<std::tuple<std::tuple<int,int,int,void(*)(int_const*,unsigned_char_const*,int,int,int,unsigned_char*,int,int,int,int,int,int,int,ConvolveParams*,short,short,short,short)>,int,int,int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x20);
  Test::Test(this_00);
  *(undefined4 *)
   &this_00[1].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__AV1WarpFilterTest_01078360;
  this_00[1]._vptr_Test = (_func_int **)&PTR__AV1WarpFilterTest_CheckOutput_Test_010783a0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }